

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,ArrayPtr<const_char> *first,
          ArrayPtr<const_char> *rest,ArrayPtr<const_char> *rest_1,String *rest_2,
          ArrayPtr<const_char> *rest_3,CappedArray<char,_14UL> *rest_4,ArrayPtr<const_char> *rest_5,
          StringTree *rest_6,ArrayPtr<const_char> *rest_7,ArrayPtr<const_char> *rest_8,
          ArrayPtr<const_char> *rest_9,ArrayPtr<const_char> *rest_10,ArrayPtr<const_char> *rest_11,
          String *rest_12,ArrayPtr<const_char> *rest_13,ArrayPtr<const_char> *rest_14,
          ArrayPtr<const_char> *rest_15,String *rest_16,ArrayPtr<const_char> *rest_17,
          CappedArray<char,_14UL> *rest_18,ArrayPtr<const_char> *rest_19,StringTree *rest_20,
          ArrayPtr<const_char> *rest_21,ArrayPtr<const_char> *rest_22,ArrayPtr<const_char> *rest_23,
          ArrayPtr<const_char> *rest_24,ArrayPtr<const_char> *rest_25,String *rest_26,
          ArrayPtr<const_char> *rest_27,ArrayPtr<const_char> *rest_28,ArrayPtr<const_char> *rest_29,
          String *rest_30,ArrayPtr<const_char> *rest_31,CappedArray<char,_14UL> *rest_32,
          ArrayPtr<const_char> *rest_33,StringTree *rest_34,ArrayPtr<const_char> *rest_35,
          String *rest_36,ArrayPtr<const_char> *rest_37,ArrayPtr<const_char> *rest_38,
          ArrayPtr<const_char> *rest_39,ArrayPtr<const_char> *rest_40,ArrayPtr<const_char> *rest_41,
          ArrayPtr<const_char> *rest_42,ArrayPtr<const_char> *rest_43,String *rest_44,
          ArrayPtr<const_char> *rest_45,CappedArray<char,_14UL> *rest_46,
          ArrayPtr<const_char> *rest_47)

{
  char *pos_00;
  
  pos_00 = _::fill<kj::ArrayPtr<char_const>>(pos,first);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (this,pos_00,branchIndex,rest,rest_1,rest_2,rest_3,rest_4,rest_5,rest_6,rest_7,rest_8,
             rest_9,rest_10,rest_11,rest_12,rest_13,rest_14,rest_15,rest_16,rest_17,rest_18,rest_19,
             rest_20,rest_21,rest_22,rest_23,rest_24,rest_25,rest_26,rest_27,rest_28,rest_29,rest_30
             ,rest_31,rest_32,rest_33,rest_34,rest_35,rest_36,rest_37,rest_38,rest_39,rest_40,
             rest_41,rest_42,rest_43,rest_44,rest_45,rest_46,rest_47);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, First&& first, Rest&&... rest) {
  pos = _::fill(pos, kj::fwd<First>(first));
  fill(pos, branchIndex, kj::fwd<Rest>(rest)...);
}